

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# decomp.c
# Opt level: O1

void ddb(Integer ndims,Integer *ardims,Integer npes,Integer *blk,Integer *pedims)

{
  Integer *pIVar1;
  bool bVar2;
  undefined1 auVar3 [16];
  long lVar4;
  Integer *ardims_00;
  Integer *blk_00;
  Integer *pedims_00;
  long lVar5;
  long lVar6;
  ulong uVar7;
  size_t __nmemb;
  long lVar8;
  undefined1 auVar9 [16];
  undefined1 auVar10 [16];
  undefined1 auVar11 [16];
  
  __nmemb = 0;
  lVar5 = ndims;
  if (0 < ndims) {
    do {
      lVar8 = lVar5 + -1;
      lVar4 = blk[lVar5 + -1];
      if (lVar4 < 1) {
        pedims[lVar8] = -1;
        __nmemb = __nmemb + 1;
      }
      else {
        lVar4 = (ardims[lVar8] + lVar4 + -1) / lVar4;
        if (npes < lVar4) {
          pedims[lVar8] = npes;
          npes = 1;
        }
        else {
          lVar6 = lVar4;
          if (lVar4 < npes) {
            do {
              lVar6 = lVar4;
              if (npes % lVar4 == 0) break;
              lVar4 = lVar4 + 1;
              lVar6 = npes;
            } while (npes != lVar4);
          }
          pedims[lVar8] = lVar6;
          npes = npes / lVar6;
        }
      }
      bVar2 = 1 < lVar5;
      lVar5 = lVar8;
    } while (bVar2);
  }
  if ((long)__nmemb < 1) {
    if (0 < ndims) {
      lVar5 = 0;
      do {
        if (pedims[lVar5] < 0) {
          pedims[lVar5] = 1;
        }
        lVar5 = lVar5 + 1;
      } while (ndims != lVar5);
    }
  }
  else {
    ardims_00 = (Integer *)calloc(__nmemb,8);
    if (ardims_00 == (Integer *)0x0) {
      ddb_cold_3();
    }
    else {
      blk_00 = (Integer *)calloc(__nmemb,8);
      if (blk_00 == (Integer *)0x0) {
        ddb_cold_2();
      }
      else {
        pedims_00 = (Integer *)calloc(__nmemb,8);
        auVar3 = _DAT_001b19e0;
        if (pedims_00 != (Integer *)0x0) {
          lVar5 = __nmemb - 1;
          auVar9._8_4_ = (int)lVar5;
          auVar9._0_8_ = lVar5;
          auVar9._12_4_ = (int)((ulong)lVar5 >> 0x20);
          uVar7 = 0;
          auVar9 = auVar9 ^ _DAT_001b19e0;
          auVar10 = _DAT_001b1a00;
          do {
            auVar11 = auVar10 ^ auVar3;
            if ((bool)(~(auVar11._4_4_ == auVar9._4_4_ && auVar9._0_4_ < auVar11._0_4_ ||
                        auVar9._4_4_ < auVar11._4_4_) & 1)) {
              blk_00[uVar7] = 1;
            }
            if ((auVar11._12_4_ != auVar9._12_4_ || auVar11._8_4_ <= auVar9._8_4_) &&
                auVar11._12_4_ <= auVar9._12_4_) {
              blk_00[uVar7 + 1] = 1;
            }
            uVar7 = uVar7 + 2;
            lVar5 = auVar10._8_8_;
            auVar10._0_8_ = auVar10._0_8_ + 2;
            auVar10._8_8_ = lVar5 + 2;
          } while ((__nmemb + 1 & 0xfffffffffffffffe) != uVar7);
          if (0 < ndims) {
            lVar5 = 0;
            lVar4 = 0;
            do {
              if (pedims[lVar4] < 0) {
                ardims_00[lVar5] = ardims[lVar4];
                lVar5 = lVar5 + 1;
              }
              lVar4 = lVar4 + 1;
            } while (ndims != lVar4);
          }
          ddb_h2(__nmemb,ardims_00,npes,0.1,0,blk_00,pedims_00);
          if (0 < ndims) {
            lVar5 = 0;
            lVar4 = 0;
            do {
              if (pedims[lVar4] < 0) {
                blk[lVar4] = (ardims_00[lVar5] + pedims_00[lVar5] + -1) / pedims_00[lVar5];
                lVar5 = lVar5 + 1;
              }
              lVar4 = lVar4 + 1;
            } while (ndims != lVar4);
          }
          if (0 < ndims) {
            lVar5 = 0;
            lVar4 = 0;
            do {
              if (pedims[lVar4] < 0) {
                pIVar1 = pedims_00 + lVar5;
                lVar5 = lVar5 + 1;
                pedims[lVar4] = *pIVar1;
              }
              lVar4 = lVar4 + 1;
            } while (ndims != lVar4);
          }
          free(pedims_00);
          free(blk_00);
          free(ardims_00);
          return;
        }
        ddb_cold_1();
      }
    }
  }
  return;
}

Assistant:

void ddb(Integer ndims, Integer ardims[], Integer npes, Integer blk[],
         Integer pedims[])
{
    double ddb_threshold = 0.1;
    long ddb_bias = 0;
    long i, j;
    Integer count = 0;
    Integer *tardim, *tblk, *tpedim;
    long tp, sp;

    tp = (long)npes;

    /* count how many axes have <don't care> block values.*/
    for(i=ndims-1;i>=0;i--){
       if(blk[i]<=0){
          pedims[i] = -1;
          count += 1;
       } else {
          sp = (long)(ardims[i]+blk[i]-1)/blk[i];
          if(sp>tp) {
             sp = tp; tp = 1;
             pedims[i] = (Integer)sp;
          } else {
             for(j=sp;j<tp&&(tp%j!=0);j++);
             pedims[i] = (Integer)j;
             tp = tp / j;
          }
       }
    }

    if(count>0){
       tardim = (Integer *) calloc((size_t)count,sizeof(Integer));
       if(tardim==NULL) {
         fprintf(stderr,"ddb: Memory allocation failed\n");
         for(i=0;i<ndims;i++) pedims[i] = 0;
         return;
       }
       tblk = (Integer *) calloc((size_t)count,sizeof(Integer));
       if(tblk==NULL) {
          fprintf(stderr,"ddb: Memory allocation failed\n");
          for(i=0;i<ndims;i++) pedims[i] = 0;
          return;
       }
       tpedim = (Integer *) calloc((size_t)count,sizeof(Integer));
       if(tpedim==NULL) {
          fprintf(stderr,"ddb: Memory allocation failed\n");
          for(i=0;i<ndims;i++) pedims[i] = 0;
          return;
       }

       for(i=0;i<count;i++) tblk[i] = 1;
       for(i=0,j=0;j<ndims;j++) 
          if(pedims[j]<0) tardim[i++] = ardims[j];

       ddb_h2( count, tardim, (Integer)tp, ddb_threshold, ddb_bias, tblk, tpedim);
       /* ddb_h1( count, tardim, tp, ddb_threshold, tblk, tpedim); */

       for(i=0,j=0;j<ndims;j++)
          if(pedims[j]<0){
             blk[j] = (tardim[i]+tpedim[i]-1)/tpedim[i];
             i = i+1;
          }

       for(i=0,j=0;j<ndims;j++)
          if(pedims[j]<0) pedims[j] = tpedim[i++];

       free( tpedim ); 
       free( tblk ); 
       free( tardim ); 
    } else {
       for(j=0;j<ndims;j++)
          if(pedims[j]<0) pedims[j] = 1;
    }

}